

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O3

void __thiscall arith_uint256_tests::bignum_SetCompact::test_method(bignum_SetCompact *this)

{
  undefined1 *num_args;
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  char *local_ad0;
  char *local_ac8;
  undefined1 *local_ac0;
  undefined1 *local_ab8;
  char *local_ab0;
  char *local_aa8;
  undefined1 *local_aa0;
  undefined1 *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  undefined1 *local_a00;
  undefined1 *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 local_15c [20];
  char *local_148;
  char *local_140;
  lazy_ostream local_138;
  undefined1 *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  bool fOverflow;
  bool fNegative;
  undefined1 local_f0 [24];
  assertion_result local_d8;
  string *local_c0;
  undefined **local_b8;
  undefined1 local_b0;
  undefined1 *local_a8;
  string *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  string **local_80;
  string local_78;
  arith_uint256 num;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  num.super_base_uint<256U>.pn[4] = 0;
  num.super_base_uint<256U>.pn[5] = 0;
  num.super_base_uint<256U>.pn[6] = 0;
  num.super_base_uint<256U>.pn[7] = 0;
  num.super_base_uint<256U>.pn[0] = 0;
  num.super_base_uint<256U>.pn[1] = 0;
  num.super_base_uint<256U>.pn[2] = 0;
  num.super_base_uint<256U>.pn[3] = 0;
  arith_uint256::SetCompact(&num,0,&fNegative,&fOverflow);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x19f;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_80 = &local_c0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x19f,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_140 = "";
  local_15c._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_15c._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1a0;
  file_00.m_begin = (iterator)&local_148;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)(local_15c + 4),
             msg_00);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_80 = (string **)(local_f0 + 8);
  local_f0._0_4_ = uVar3;
  local_c0 = (string *)local_15c;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1a0,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1a1;
  file_01.m_begin = (iterator)&local_170;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
             msg_01);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1a1,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1a2;
  file_02.m_begin = (iterator)&local_190;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a0,
             msg_02);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1a2,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x123456,&fNegative,&fOverflow);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1a5;
  file_03.m_begin = (iterator)&local_1b0;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1c0,
             msg_03);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1a5,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1a6;
  file_04.m_begin = (iterator)&local_1d0;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e0,
             msg_04);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1a6,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1a7;
  file_05.m_begin = (iterator)&local_1f0;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_200,
             msg_05);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1a7,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1a8;
  file_06.m_begin = (iterator)&local_210;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_220,
             msg_06);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1a8,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x1003456,&fNegative,&fOverflow);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1ab;
  file_07.m_begin = (iterator)&local_230;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_240,
             msg_07);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1ab,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1ac;
  file_08.m_begin = (iterator)&local_250;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_260,
             msg_08);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1ac,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1ad;
  file_09.m_begin = (iterator)&local_270;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_280,
             msg_09);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1ad,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1ae;
  file_10.m_begin = (iterator)&local_290;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2a0,
             msg_10);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1ae,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x2000056,&fNegative,&fOverflow);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x1b1;
  file_11.m_begin = (iterator)&local_2b0;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2c0,
             msg_11);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1b1,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x1b2;
  file_12.m_begin = (iterator)&local_2d0;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2e0,
             msg_12);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1b2,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x1b3;
  file_13.m_begin = (iterator)&local_2f0;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_300,
             msg_13);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1b3,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x1b4;
  file_14.m_begin = (iterator)&local_310;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_320,
             msg_14);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1b4,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x3000000,&fNegative,&fOverflow);
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x1b7;
  file_15.m_begin = (iterator)&local_330;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_340,
             msg_15);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1b7,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x1b8;
  file_16.m_begin = (iterator)&local_350;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_360,
             msg_16);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1b8,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x1b9;
  file_17.m_begin = (iterator)&local_370;
  msg_17.m_end = pvVar5;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_380,
             msg_17);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1b9,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x1ba;
  file_18.m_begin = (iterator)&local_390;
  msg_18.m_end = pvVar5;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_3a0,
             msg_18);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1ba,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x4000000,&fNegative,&fOverflow);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x1bd;
  file_19.m_begin = (iterator)&local_3b0;
  msg_19.m_end = pvVar5;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_3c0,
             msg_19);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1bd,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x1be;
  file_20.m_begin = (iterator)&local_3d0;
  msg_20.m_end = pvVar5;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_3e0,
             msg_20);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1be,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x1bf;
  file_21.m_begin = (iterator)&local_3f0;
  msg_21.m_end = pvVar5;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_400,
             msg_21);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1bf,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x1c0;
  file_22.m_begin = (iterator)&local_410;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_420,
             msg_22);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1c0,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x923456,&fNegative,&fOverflow);
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x1c3;
  file_23.m_begin = (iterator)&local_430;
  msg_23.m_end = pvVar5;
  msg_23.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_440,
             msg_23);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1c3,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x1c4;
  file_24.m_begin = (iterator)&local_450;
  msg_24.m_end = pvVar5;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_460,
             msg_24);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1c4,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x1c5;
  file_25.m_begin = (iterator)&local_470;
  msg_25.m_end = pvVar5;
  msg_25.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_480,
             msg_25);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1c5,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x1c6;
  file_26.m_begin = (iterator)&local_490;
  msg_26.m_end = pvVar5;
  msg_26.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_4a0,
             msg_26);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1c6,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x1803456,&fNegative,&fOverflow);
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x1c9;
  file_27.m_begin = (iterator)&local_4b0;
  msg_27.m_end = pvVar5;
  msg_27.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_4c0,
             msg_27);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1c9,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x1ca;
  file_28.m_begin = (iterator)&local_4d0;
  msg_28.m_end = pvVar5;
  msg_28.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_4e0,
             msg_28);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1ca,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x1cb;
  file_29.m_begin = (iterator)&local_4f0;
  msg_29.m_end = pvVar5;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_500,
             msg_29);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1cb,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x1cc;
  file_30.m_begin = (iterator)&local_510;
  msg_30.m_end = pvVar5;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_520,
             msg_30);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1cc,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x2800056,&fNegative,&fOverflow);
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x1cf;
  file_31.m_begin = (iterator)&local_530;
  msg_31.m_end = pvVar5;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_540,
             msg_31);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1cf,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x1d0;
  file_32.m_begin = (iterator)&local_550;
  msg_32.m_end = pvVar5;
  msg_32.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_560,
             msg_32);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1d0,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x1d1;
  file_33.m_begin = (iterator)&local_570;
  msg_33.m_end = pvVar5;
  msg_33.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_580,
             msg_33);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1d1,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x1d2;
  file_34.m_begin = (iterator)&local_590;
  msg_34.m_end = pvVar5;
  msg_34.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_5a0,
             msg_34);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1d2,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x3800000,&fNegative,&fOverflow);
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x1d5;
  file_35.m_begin = (iterator)&local_5b0;
  msg_35.m_end = pvVar5;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_5c0,
             msg_35);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1d5,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x1d6;
  file_36.m_begin = (iterator)&local_5d0;
  msg_36.m_end = pvVar5;
  msg_36.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_5e0,
             msg_36);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1d6,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x1d7;
  file_37.m_begin = (iterator)&local_5f0;
  msg_37.m_end = pvVar5;
  msg_37.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_600,
             msg_37);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1d7,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x1d8;
  file_38.m_begin = (iterator)&local_610;
  msg_38.m_end = pvVar5;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_620,
             msg_38);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1d8,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x4800000,&fNegative,&fOverflow);
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x1db;
  file_39.m_begin = (iterator)&local_630;
  msg_39.m_end = pvVar5;
  msg_39.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_640,
             msg_39);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  local_a0 = (string *)local_f0;
  local_80 = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1db,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x1dc;
  file_40.m_begin = (iterator)&local_650;
  msg_40.m_end = pvVar5;
  msg_40.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_660,
             msg_40);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_f0._8_8_ = (string *)local_f0;
  local_a0 = (string *)&local_c0;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1dc,
             &local_98,"0U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x1dd;
  file_41.m_begin = (iterator)&local_670;
  msg_41.m_end = pvVar5;
  msg_41.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_680,
             msg_41);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = (string *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1dd,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x1de;
  file_42.m_begin = (iterator)&local_690;
  msg_42.m_end = pvVar5;
  msg_42.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_6a0,
             msg_42);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1de,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x1123456,&fNegative,&fOverflow);
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x1e1;
  file_43.m_begin = (iterator)&local_6b0;
  msg_43.m_end = pvVar5;
  msg_43.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_6c0,
             msg_43);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000000012");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000000012";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1e1,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000000012\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x1e2;
  file_44.m_begin = (iterator)&local_6d0;
  msg_44.m_end = pvVar5;
  msg_44.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_6e0,
             msg_44);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_80 = (string **)(local_f0 + 8);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x1120000;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x1120000;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1e2,
             &local_98,"0x01120000U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x1e3;
  file_45.m_begin = (iterator)&local_6f0;
  msg_45.m_end = pvVar5;
  msg_45.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_700,
             msg_45);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1e3,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x1e4;
  file_46.m_begin = (iterator)&local_710;
  msg_46.m_end = pvVar5;
  msg_46.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_720,
             msg_46);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1e4,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  num.super_base_uint<256U>.pn[2] = 0;
  num.super_base_uint<256U>.pn[3] = 0;
  num.super_base_uint<256U>.pn[4] = 0;
  num.super_base_uint<256U>.pn[5] = 0;
  num.super_base_uint<256U>.pn[6] = 0;
  num.super_base_uint<256U>.pn[7] = 0;
  num.super_base_uint<256U>.pn[0] = 0x80;
  num.super_base_uint<256U>.pn[1] = 0;
  local_730 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x1e8;
  file_47.m_begin = (iterator)&local_730;
  msg_47.m_end = pvVar5;
  msg_47.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_740,
             msg_47);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x2008000;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x2008000;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1e8,
             &local_98,"0x02008000U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x1fedcba,&fNegative,&fOverflow);
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x1eb;
  file_48.m_begin = (iterator)&local_750;
  msg_48.m_end = pvVar5;
  msg_48.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_760,
             msg_48);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"000000000000000000000000000000000000000000000000000000000000007e");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  num_args = local_f0 + 8;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "000000000000000000000000000000000000000000000000000000000000007e";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)num_args,0x1eb,&local_98,
             "\"000000000000000000000000000000000000000000000000000000000000007e\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x1ec;
  file_49.m_begin = (iterator)&local_770;
  msg_49.m_end = pvVar5;
  msg_49.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_780,
             msg_49);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,true);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x1fe0000;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x1fe0000;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)num_args;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38e3e,(size_t)&local_d8,0x1ec,
             &local_98,"0x01fe0000U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x1ed;
  file_50.m_begin = (iterator)&local_790;
  msg_50.m_end = pvVar5;
  msg_50.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_7a0,
             msg_50);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0[0] = 1;
  local_78._M_dataplus._M_p._0_1_ = fNegative;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)num_args;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1ed,
             &local_98,"true",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x1ee;
  file_51.m_begin = (iterator)&local_7b0;
  msg_51.m_end = pvVar5;
  msg_51.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_7c0,
             msg_51);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = (ulong)(uint7)local_f0._1_7_ << 8;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)num_args;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1ee,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x2123456,&fNegative,&fOverflow);
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x1f1;
  file_52.m_begin = (iterator)&local_7d0;
  msg_52.m_end = pvVar5;
  msg_52.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_7e0,
             msg_52);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000001234");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000001234";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1f1,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000001234\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x1f2;
  file_53.m_begin = (iterator)&local_7f0;
  msg_53.m_end = pvVar5;
  msg_53.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_800,
             msg_53);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x2123400;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x2123400;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1f2,
             &local_98,"0x02123400U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x1f3;
  file_54.m_begin = (iterator)&local_810;
  msg_54.m_end = pvVar5;
  msg_54.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_820,
             msg_54);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,499,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x1f4;
  file_55.m_begin = (iterator)&local_830;
  msg_55.m_end = pvVar5;
  msg_55.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_840,
             msg_55);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,500,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x3123456,&fNegative,&fOverflow);
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x1f7;
  file_56.m_begin = (iterator)&local_850;
  msg_56.m_end = pvVar5;
  msg_56.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_860,
             msg_56);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000000123456");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000000123456";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1f7,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000000123456\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0x1f8;
  file_57.m_begin = (iterator)&local_870;
  msg_57.m_end = pvVar5;
  msg_57.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_880,
             msg_57);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x3123456;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x3123456;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1f8,
             &local_98,"0x03123456U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  file_58.m_end = (iterator)0x1f9;
  file_58.m_begin = (iterator)&local_890;
  msg_58.m_end = pvVar5;
  msg_58.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_8a0,
             msg_58);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1f9,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0x1fa;
  file_59.m_begin = (iterator)&local_8b0;
  msg_59.m_end = pvVar5;
  msg_59.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_8c0,
             msg_59);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x1fa,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x4123456,&fNegative,&fOverflow);
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_8c8 = "";
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_60.m_end = (iterator)0x1fd;
  file_60.m_begin = (iterator)&local_8d0;
  msg_60.m_end = pvVar5;
  msg_60.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_8e0,
             msg_60);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000012345600");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000012345600";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x1fd,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000012345600\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0x1fe;
  file_61.m_begin = (iterator)&local_8f0;
  msg_61.m_end = pvVar5;
  msg_61.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_900,
             msg_61);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x4123456;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x4123456;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x1fe,
             &local_98,"0x04123456U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  file_62.m_end = (iterator)0x1ff;
  file_62.m_begin = (iterator)&local_910;
  msg_62.m_end = pvVar5;
  msg_62.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_920,
             msg_62);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x1ff,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_928 = "";
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0x200;
  file_63.m_begin = (iterator)&local_930;
  msg_63.m_end = pvVar5;
  msg_63.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_940,
             msg_63);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x200,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x4923456,&fNegative,&fOverflow);
  local_950 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_948 = "";
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  file_64.m_end = (iterator)0x203;
  file_64.m_begin = (iterator)&local_950;
  msg_64.m_end = pvVar5;
  msg_64.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_960,
             msg_64);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000012345600");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000012345600";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  local_80 = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x203,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000012345600\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  file_65.m_end = (iterator)0x204;
  file_65.m_begin = (iterator)&local_970;
  msg_65.m_end = pvVar5;
  msg_65.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_980,
             msg_65);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,true);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x4923456;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x4923456;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_a0 = (string *)&local_c0;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38e3e,(size_t)&local_d8,0x204,
             &local_98,"0x04923456U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_988 = "";
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  file_66.m_end = (iterator)0x205;
  file_66.m_begin = (iterator)&local_990;
  msg_66.m_end = pvVar5;
  msg_66.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_9a0,
             msg_66);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0[0] = 1;
  local_78._M_dataplus._M_p._0_1_ = fNegative;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x205,
             &local_98,"true",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_9b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_9a8 = "";
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_67.m_end = (iterator)0x206;
  file_67.m_begin = (iterator)&local_9b0;
  msg_67.m_end = pvVar5;
  msg_67.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_9c0,
             msg_67);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = (ulong)(uint7)local_f0._1_7_ << 8;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x206,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x5009234,&fNegative,&fOverflow);
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_68.m_end = (iterator)0x209;
  file_68.m_begin = (iterator)&local_9d0;
  msg_68.m_end = pvVar5;
  msg_68.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_9e0,
             msg_68);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"0000000000000000000000000000000000000000000000000000000092340000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "0000000000000000000000000000000000000000000000000000000092340000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x209,&local_98,
             "\"0000000000000000000000000000000000000000000000000000000092340000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_9e8 = "";
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_69.m_end = (iterator)0x20a;
  file_69.m_begin = (iterator)&local_9f0;
  msg_69.m_end = pvVar5;
  msg_69.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_a00,
             msg_69);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x5009234;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x5009234;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_80 = (string **)(local_f0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x20a,
             &local_98,"0x05009234U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_70.m_end = (iterator)0x20b;
  file_70.m_begin = (iterator)&local_a10;
  msg_70.m_end = pvVar5;
  msg_70.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_a20,
             msg_70);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x20b,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a28 = "";
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_71.m_end = (iterator)0x20c;
  file_71.m_begin = (iterator)&local_a30;
  msg_71.m_end = pvVar5;
  msg_71.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_a40,
             msg_71);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_f0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x20c,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0x20123456,&fNegative,&fOverflow);
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a48 = "";
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_72.m_end = (iterator)0x20f;
  file_72.m_begin = (iterator)&local_a50;
  msg_72.m_end = pvVar5;
  msg_72.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_a60,
             msg_72);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_78,&num);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"1234560000000000000000000000000000000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
       + 0x6c;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_c0;
  local_f0._0_8_ = "1234560000000000000000000000000000000000000000000000000000000000";
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013898d8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)local_f0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_138,1,2,REQUIRE,0xe38ca9,(size_t)(local_f0 + 8),0x20f,&local_98,
             "\"1234560000000000000000000000000000000000000000000000000000000000\"",&local_b8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,(byte)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  local_a70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_73.m_end = (iterator)0x210;
  file_73.m_begin = (iterator)&local_a70;
  msg_73.m_end = pvVar5;
  msg_73.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_a80,
             msg_73);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  uVar3 = arith_uint256::GetCompact(&num,false);
  local_f0._0_4_ = uVar3;
  local_15c._0_4_ = 0x20123456;
  local_78._M_dataplus._M_p._0_1_ = uVar3 == 0x20123456;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388f88;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_c0 = (string *)local_15c;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01388f88;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38cf9,(size_t)&local_d8,0x210,
             &local_98,"0x20123456U",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a88 = "";
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_74.m_end = (iterator)0x211;
  file_74.m_begin = (iterator)&local_a90;
  msg_74.m_end = pvVar5;
  msg_74.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_aa0,
             msg_74);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fNegative;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = (string *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x211,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_ab0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_aa8 = "";
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_75.m_end = (iterator)0x212;
  file_75.m_begin = (iterator)&local_ab0;
  msg_75.m_end = pvVar5;
  msg_75.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_ac0,
             msg_75);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fOverflow ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_c0 = (string *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x212,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  arith_uint256::SetCompact(&num,0xff123456,&fNegative,&fOverflow);
  local_ad0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ac8 = "";
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_76.m_end = (iterator)0x215;
  file_76.m_begin = (iterator)&local_ad0;
  msg_76.m_end = pvVar5;
  msg_76.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_ae0,
             msg_76);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
  local_78._M_dataplus._M_p._0_1_ = fNegative ^ 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_f0._8_8_ = &fNegative;
  local_c0 = (string *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d0a,(size_t)&local_d8,0x215,
             &local_98,"false",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ae8 = "";
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_77.m_end = (iterator)0x216;
  file_77.m_begin = (iterator)&local_af0;
  msg_77.m_end = pvVar5;
  msg_77.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_b00,
             msg_77);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_f0[0] = 1;
  local_78._M_dataplus._M_p._0_1_ = fOverflow;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8.m_message.px = (element_type *)0xe37160;
  local_f0._8_8_ = &fOverflow;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01389268;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (string **)(local_f0 + 8);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_01389268;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (string *)&local_c0;
  local_c0 = (string *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_138,1,2,REQUIRE,0xe38d14,(size_t)&local_d8,0x216,
             &local_98,"true",&local_b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bignum_SetCompact)
{
    arith_uint256 num;
    bool fNegative;
    bool fOverflow;
    num.SetCompact(0, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x00123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01003456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02000056, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03000000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04000000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x00923456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01803456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02800056, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03800000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04800000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000012");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x01120000U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    // Make sure that we don't generate compacts with the 0x00800000 bit set
    num = 0x80;
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x02008000U);

    num.SetCompact(0x01fedcba, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "000000000000000000000000000000000000000000000000000000000000007e");
    BOOST_CHECK_EQUAL(num.GetCompact(true), 0x01fe0000U);
    BOOST_CHECK_EQUAL(fNegative, true);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000001234");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x02123400U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000123456");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x03123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000012345600");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x04123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04923456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000012345600");
    BOOST_CHECK_EQUAL(num.GetCompact(true), 0x04923456U);
    BOOST_CHECK_EQUAL(fNegative, true);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x05009234, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000092340000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x05009234U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x20123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "1234560000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x20123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0xff123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, true);
}